

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

CheckerInstantiationSyntax * __thiscall
slang::parsing::Parser::parseCheckerInstantiation(Parser *this,AttrList attributes)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements_00;
  Token semi_00;
  ParameterValueAssignmentSyntax *pPVar1;
  CheckerInstantiationSyntax *pCVar2;
  EVP_PKEY_CTX *src;
  Info *extraout_RDX;
  Token *in_RDI;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> items;
  Token semi;
  ParameterValueAssignmentSyntax *parameters;
  NameSyntax *type;
  Token *in_stack_fffffffffffffdc0;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *this_00;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffdcc;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffdd0;
  Info *pIVar4;
  Parser *in_stack_fffffffffffffeb8;
  RequireItems in_stack_fffffffffffffed4;
  SmallVectorBase<slang::syntax::TokenOrSyntax> *in_stack_fffffffffffffee8;
  ParserBase *in_stack_fffffffffffffef0;
  DiagCode in_stack_ffffffffffffff00;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff08;
  AllowEmpty in_stack_ffffffffffffff10;
  Parser *in_stack_ffffffffffffff78;
  bitmask<slang::parsing::detail::NameOptions> in_stack_ffffffffffffff84;
  ParameterValueAssignmentSyntax *local_40;
  NameSyntax *pNStack_38;
  bitmask<slang::parsing::detail::NameOptions> local_24;
  NameSyntax *local_20;
  
  bitmask<slang::parsing::detail::NameOptions>::bitmask(&local_24,NoClassScope);
  local_20 = parseName(in_stack_ffffffffffffff78,in_stack_ffffffffffffff84);
  pPVar1 = parseParameterValueAssignment(in_stack_fffffffffffffeb8);
  Token::Token(in_stack_fffffffffffffdc0);
  SmallVector<slang::syntax::TokenOrSyntax,_8UL>::SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)0x6c08cd);
  this_00 = (SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)
            &stack0xfffffffffffffed8;
  uVar3 = 0;
  ParserBase::
  parseList<&slang::syntax::SyntaxFacts::isPossibleInstance,&slang::syntax::SyntaxFacts::isSemicolon,slang::parsing::Parser::parseCheckerInstantiation(std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>)::__0>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,XorEqual,IntegerLiteral,in_RDI,
             in_stack_fffffffffffffed4,in_stack_ffffffffffffff00,
             (anon_class_8_1_8991fb9c *)in_stack_ffffffffffffff08._M_extent_value,
             in_stack_ffffffffffffff10);
  elements._M_ptr._4_4_ = in_stack_fffffffffffffdcc;
  elements._M_ptr._0_4_ = uVar3;
  elements._M_extent._M_extent_value = in_stack_fffffffffffffdd0._M_extent_value;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this_00,elements);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
            ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)&stack0xfffffffffffffee8,
             *(EVP_PKEY_CTX **)in_RDI,src);
  elements_00._M_ptr._4_4_ = in_stack_fffffffffffffdcc;
  elements_00._M_ptr._0_4_ = uVar3;
  elements_00._M_extent._M_extent_value = in_stack_fffffffffffffdd0._M_extent_value;
  pIVar4 = extraout_RDX;
  slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::SeparatedSyntaxList
            (this_00,elements_00);
  semi_00.info = pIVar4;
  semi_00._0_8_ = pPVar1;
  pCVar2 = slang::syntax::SyntaxFactory::checkerInstantiation
                     ((SyntaxFactory *)in_stack_fffffffffffffdd0._M_extent_value,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                      CONCAT44(in_stack_fffffffffffffdcc,uVar3),pNStack_38,local_40,
                      (SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)0x6c0a0e,
                      semi_00);
  SmallVector<slang::syntax::TokenOrSyntax,_8UL>::~SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)0x6c0a22);
  return pCVar2;
}

Assistant:

CheckerInstantiationSyntax& Parser::parseCheckerInstantiation(AttrList attributes) {
    auto& type = parseName(NameOptions::NoClassScope);
    auto parameters = parseParameterValueAssignment();

    Token semi;
    SmallVector<TokenOrSyntax, 8> items;
    parseList<isPossibleInstance, isSemicolon>(items, TokenKind::Semicolon, TokenKind::Comma, semi,
                                               RequireItems::True,
                                               diag::ExpectedHierarchicalInstantiation,
                                               [this] { return &parseHierarchicalInstance(); });

    return factory.checkerInstantiation(attributes, type, parameters, items.copy(alloc), semi);
}